

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(static_string_view *l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string local_38;
  
  __x = l->super_string_view;
  StringOpPlus::operator_cast_to_string(&local_38,(StringOpPlus *)r);
  __y._M_str = local_38._M_dataplus._M_p;
  __y._M_len = local_38._M_string_length;
  bVar1 = std::operator==(__x,__y);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

static string_view view(static_string_view const& s) { return s; }